

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Radio_Communications_Header.cpp
# Opt level: O3

KDataStream * __thiscall
KDIS::PDU::Radio_Communications_Header::Encode
          (KDataStream *__return_storage_ptr__,Radio_Communications_Header *this)

{
  KDataStream::KDataStream(__return_storage_ptr__,Big_Endian);
  Header7::Encode(&this->super_Header,__return_storage_ptr__);
  (*(this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EntityID,__return_storage_ptr__);
  KDataStream::Write<unsigned_short>(__return_storage_ptr__,this->m_ui16RadioID);
  return __return_storage_ptr__;
}

Assistant:

KDataStream Radio_Communications_Header::Encode() const
{
    KDataStream stream;

    Radio_Communications_Header::Encode( stream );

    return stream;
}